

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::mouseDoubleClickEvent(QAbstractItemView *this,QMouseEvent *event)

{
  bool bVar1;
  MouseButton MVar2;
  MouseButtons MVar3;
  KeyboardModifiers KVar4;
  MouseEventSource MVar5;
  uint uVar6;
  int iVar7;
  QAbstractItemViewPrivate *pQVar8;
  QPointingDevice *pQVar9;
  QStyle *pQVar10;
  QSinglePointEvent *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QAbstractItemViewPrivate *d;
  QPersistentModelIndex persistent;
  QMouseEvent me;
  QModelIndex index;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  QPointF *in_stack_fffffffffffffeb0;
  QPersistentModelIndex local_110 [3];
  QPersistentModelIndex local_f8 [3];
  QPersistentModelIndex local_e0 [3];
  QPersistentModelIndex local_c8;
  QPointF local_c0;
  QPointF local_b0;
  QPointF local_a0;
  QMouseEvent local_90 [80];
  QPointF local_40;
  QPoint local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = d_func((QAbstractItemView *)0x805e06);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = QSinglePointEvent::position((QSinglePointEvent *)0x805e42);
  local_30 = QPointF::toPoint(in_stack_fffffffffffffeb0);
  (**(code **)(*in_RDI + 0x1f0))(&local_28,in_RDI,&local_30);
  bVar1 = QModelIndex::isValid
                    ((QModelIndex *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  if (((!bVar1) ||
      (bVar1 = QAbstractItemViewPrivate::isIndexEnabled
                         ((QAbstractItemViewPrivate *)
                          CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                          (QModelIndex *)
                          CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)), !bVar1))
     || (bVar1 = ::operator!=((QPersistentModelIndex *)
                              CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                              (QModelIndex *)
                              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)), bVar1)
     ) {
    memset(local_90,0xaa,0x50);
    local_a0 = QSinglePointEvent::position((QSinglePointEvent *)0x805ef5);
    local_b0 = QSinglePointEvent::scenePosition((QSinglePointEvent *)0x805f11);
    local_c0 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x805f2d);
    MVar2 = QSinglePointEvent::button(in_RSI);
    MVar3 = QSinglePointEvent::buttons
                      ((QSinglePointEvent *)
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    KVar4 = QInputEvent::modifiers
                      ((QInputEvent *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0))
    ;
    MVar5 = QMouseEvent::source();
    pQVar9 = (QPointingDevice *)QPointerEvent::pointingDevice();
    QMouseEvent::QMouseEvent
              (local_90,MouseButtonPress,(QPointF *)&local_a0,(QPointF *)&local_b0,
               (QPointF *)&local_c0,MVar2,
               (QFlags_conflict1 *)
               CONCAT44(in_stack_fffffffffffffe9c,
                        MVar3.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                        super_QFlagsStorage<Qt::MouseButton>.i),
               (QFlags_conflict1 *)
               CONCAT44(in_stack_fffffffffffffea4,
                        KVar4.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                        super_QFlagsStorage<Qt::KeyboardModifier>.i),MVar5,pQVar9);
    (**(code **)(*in_RDI + 0x98))(in_RDI,local_90);
    QMouseEvent::~QMouseEvent(local_90);
  }
  else {
    local_c8.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::QPersistentModelIndex(&local_c8,(QModelIndex *)&local_28);
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_e0);
    doubleClicked((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0)
                  ,(QModelIndex *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    MVar2 = QSinglePointEvent::button(in_RSI);
    bVar1 = false;
    if (MVar2 == LeftButton) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_f8);
      uVar6 = (**(code **)(*in_RDI + 0x2e0))(in_RDI,local_f8,2,in_RSI);
      bVar1 = false;
      if ((uVar6 & 1) == 0) {
        pQVar10 = QWidget::style((QWidget *)
                                 CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        iVar7 = (**(code **)(*(long *)pQVar10 + 0xf0))(pQVar10,0x3d,0,in_RDI);
        bVar1 = iVar7 == 0;
      }
    }
    if (bVar1) {
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_110);
      activated((QAbstractItemView *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                (QModelIndex *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    pQVar8->releaseFromDoubleClick = true;
    QPersistentModelIndex::~QPersistentModelIndex(&local_c8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QAbstractItemView);

    QModelIndex index = indexAt(event->position().toPoint());
    if (!index.isValid()
        || !d->isIndexEnabled(index)
        || (d->pressedIndex != index)) {
        QMouseEvent me(QEvent::MouseButtonPress,
                       event->position(), event->scenePosition(), event->globalPosition(),
                       event->button(), event->buttons(), event->modifiers(),
                       event->source(), event->pointingDevice());
        mousePressEvent(&me);
        return;
    }
    // signal handlers may change the model
    QPersistentModelIndex persistent = index;
    emit doubleClicked(persistent);
    if ((event->button() == Qt::LeftButton) && !edit(persistent, DoubleClicked, event)
        && !style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this))
        emit activated(persistent);
    d->releaseFromDoubleClick = true;
}